

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_table_key<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  value_type *__x;
  context<toml::type_config> *in_RDX;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  context<toml::type_config> *in_stack_00000120;
  location *in_stack_00000128;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  keys_res;
  region reg;
  spec *spec;
  location first;
  location *in_stack_fffffffffffffb58;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb68;
  location *in_stack_fffffffffffffb70;
  location *in_stack_fffffffffffffb78;
  location *in_stack_fffffffffffffb80;
  allocator<char> *__a;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *this;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffbb8;
  source_location in_stack_fffffffffffffbc0;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *in_stack_fffffffffffffbe8;
  context<toml::type_config> *in_stack_fffffffffffffbf8;
  location *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  local_2f0;
  undefined4 local_268;
  allocator<char> local_261 [17];
  string *in_stack_fffffffffffffdb0;
  location *in_stack_fffffffffffffdb8;
  sequence *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  allocator<char> local_1d1 [361];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  location::location(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::std_table(&in_stack_fffffffffffffbf8->toml_spec_);
  sequence::scan((sequence *)in_stack_fffffffffffffc58,(location *)in_stack_fffffffffffffc50);
  sequence::~sequence((sequence *)in_stack_fffffffffffffb60);
  bVar1 = region::is_ok((region *)0x652de6);
  if (bVar1) {
    location::operator=((location *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    location::advance(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    skip_whitespace<toml::type_config>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    parse_key<toml::type_config>(in_stack_00000128,in_stack_00000120);
    bVar1 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            ::is_err(&local_2f0);
    if (bVar1) {
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::unwrap_err(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
      err<toml::error_info>((error_info *)in_stack_fffffffffffffbb8);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffb60,(failure_type *)in_stack_fffffffffffffb58);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x653154);
    }
    else {
      skip_whitespace<toml::type_config>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      location::advance(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      __x = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
      std::
      make_pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                (&__x->first,(region *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb60 =
           (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            *)&stack0xfffffffffffffc30;
      ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
                (in_stack_fffffffffffffbe8);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffb60,(success_type *)in_stack_fffffffffffffb58);
      success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
      ::~success((success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
                  *)0x653258);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
               *)in_stack_fffffffffffffb60);
    }
    local_268 = 1;
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::~result((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
               *)0x6532a9);
  }
  else {
    __a = local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               &in_RDI->is_ok_,__a);
    syntax::std_table(&in_stack_fffffffffffffbf8->toml_spec_);
    location::location(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               &in_RDI->is_ok_,__a);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdb0);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffbb8);
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_fffffffffffffb60,(failure_type *)in_stack_fffffffffffffb58);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x652edd);
    error_info::~error_info((error_info *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb60);
    std::allocator<char>::~allocator(local_261);
    location::~location((location *)in_stack_fffffffffffffb60);
    sequence::~sequence((sequence *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb60);
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    local_268 = 1;
  }
  region::~region((region *)in_stack_fffffffffffffb60);
  location::~location((location *)in_stack_fffffffffffffb60);
  return this;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_table_key(location& loc, context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::std_table(spec).scan(loc);
    if(!reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_table_key: invalid table key",
            syntax::std_table(spec), loc));
    }

    loc = first;
    loc.advance(); // skip [
    skip_whitespace(loc, ctx);

    auto keys_res = parse_key(loc, ctx);
    if(keys_res.is_err())
    {
        return err(std::move(keys_res.unwrap_err()));
    }

    skip_whitespace(loc, ctx);
    loc.advance(); // ]

    return ok(std::make_pair(std::move(keys_res.unwrap().first), std::move(reg)));
}